

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

InstanceSideEffects * __thiscall
slang::ast::Compilation::getOrAddSideEffects(Compilation *this,Symbol *instanceBody)

{
  unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
  *this_00;
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  _Head_base<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_false> __ptr;
  int iVar6;
  undefined1 auVar7 [16];
  pointer __p;
  ulong pos0;
  _Head_base<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_false> _Var8;
  uint uVar9;
  ulong uVar10;
  ulong hash;
  long lVar11;
  ulong uVar12;
  pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>
  *ppVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  undefined1 auVar18 [16];
  try_emplace_args_t local_61;
  flat_hash_map<const_Symbol_*,_std::unique_ptr<InstanceSideEffects>_> *local_60;
  Symbol *local_58;
  ulong local_50;
  locator res;
  
  local_60 = &this->instanceSideEffectMap;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = instanceBody;
  hash = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
  pos0 = hash >> ((byte)(this->instanceSideEffectMap).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
                        .arrays.groups_size_index & 0x3f);
  pgVar4 = (this->instanceSideEffectMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
           .arrays.groups_;
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  ppVar5 = (this->instanceSideEffectMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
           .arrays.elements_;
  local_50 = (this->instanceSideEffectMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
             .arrays.groups_size_mask;
  uVar10 = 0;
  uVar12 = pos0;
  do {
    pgVar2 = pgVar4 + uVar12;
    uVar14 = (uchar)uVar3;
    auVar18[0] = -(pgVar2->m[0].n == uVar14);
    uVar15 = (uchar)((uint)uVar3 >> 8);
    auVar18[1] = -(pgVar2->m[1].n == uVar15);
    uVar16 = (uchar)((uint)uVar3 >> 0x10);
    auVar18[2] = -(pgVar2->m[2].n == uVar16);
    uVar17 = (uchar)((uint)uVar3 >> 0x18);
    auVar18[3] = -(pgVar2->m[3].n == uVar17);
    auVar18[4] = -(pgVar2->m[4].n == uVar14);
    auVar18[5] = -(pgVar2->m[5].n == uVar15);
    auVar18[6] = -(pgVar2->m[6].n == uVar16);
    auVar18[7] = -(pgVar2->m[7].n == uVar17);
    auVar18[8] = -(pgVar2->m[8].n == uVar14);
    auVar18[9] = -(pgVar2->m[9].n == uVar15);
    auVar18[10] = -(pgVar2->m[10].n == uVar16);
    auVar18[0xb] = -(pgVar2->m[0xb].n == uVar17);
    auVar18[0xc] = -(pgVar2->m[0xc].n == uVar14);
    auVar18[0xd] = -(pgVar2->m[0xd].n == uVar15);
    auVar18[0xe] = -(pgVar2->m[0xe].n == uVar16);
    auVar18[0xf] = -(pgVar2->m[0xf].n == uVar17);
    for (uVar9 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe); uVar9 != 0;
        uVar9 = uVar9 - 1 & uVar9) {
      iVar6 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
        }
      }
      if (*(Symbol **)((long)&ppVar5[uVar12 * 0xf].first + (ulong)(uint)(iVar6 << 4)) ==
          instanceBody) {
        ppVar13 = (pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>
                   *)((long)&ppVar5[uVar12 * 0xf].first + (ulong)(uint)(iVar6 << 4));
        goto LAB_0014549e;
      }
    }
    if ((pgVar4[uVar12].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
    lVar11 = uVar12 + uVar10;
    uVar10 = uVar10 + 1;
    uVar12 = lVar11 + 1U & local_50;
  } while (uVar10 <= local_50);
  ppVar13 = (pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>
             *)0x0;
LAB_0014549e:
  local_58 = instanceBody;
  if (ppVar13 ==
      (pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>
       *)0x0) {
    if ((this->instanceSideEffectMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
        .size_ctrl.size <
        (this->instanceSideEffectMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>>>
                       *)local_60,(arrays_type *)local_60,pos0,hash,&local_61,&local_58);
      psVar1 = &(this->instanceSideEffectMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
      ppVar13 = res.p;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>>>
                       *)local_60,hash,&local_61,&local_58);
      ppVar13 = res.p;
    }
  }
  this_00 = &ppVar13->second;
  if ((ppVar13->second)._M_t.
      super___uniq_ptr_impl<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
      ._M_t.
      super__Tuple_impl<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
      .super__Head_base<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_false>._M_head_impl ==
      (InstanceSideEffects *)0x0) {
    _Var8._M_head_impl = (InstanceSideEffects *)operator_new(0x38);
    *(undefined1 (*) [16])&(_Var8._M_head_impl)->ifacePortDrivers = (undefined1  [16])0x0;
    *(undefined8 *)&(_Var8._M_head_impl)->cannotCache = 0;
    *(undefined1 (*) [16])((long)&(_Var8._M_head_impl)->ifacePortDrivers + 0x10) =
         (undefined1  [16])0x0;
    res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)0x0;
    *(undefined1 (*) [16])((long)&(_Var8._M_head_impl)->upwardNames + 8) = (undefined1  [16])0x0;
    __ptr._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
         ._M_t.
         super__Tuple_impl<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
         .super__Head_base<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_false>._M_head_impl;
    (this_00->_M_t).
    super___uniq_ptr_impl<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
    ._M_t.
    super__Tuple_impl<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
    .super__Head_base<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_false>._M_head_impl =
         _Var8._M_head_impl;
    if (__ptr._M_head_impl != (InstanceSideEffects *)0x0) {
      std::default_delete<slang::ast::Compilation::InstanceSideEffects>::operator()
                ((default_delete<slang::ast::Compilation::InstanceSideEffects> *)this_00,
                 __ptr._M_head_impl);
    }
    if (res.pg != (group15<boost::unordered::detail::foa::plain_integral> *)0x0) {
      std::default_delete<slang::ast::Compilation::InstanceSideEffects>::operator()
                ((default_delete<slang::ast::Compilation::InstanceSideEffects> *)&res,
                 (InstanceSideEffects *)res.pg);
    }
  }
  return (this_00->_M_t).
         super___uniq_ptr_impl<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
         ._M_t.
         super__Tuple_impl<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
         .super__Head_base<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_false>._M_head_impl;
}

Assistant:

Compilation::InstanceSideEffects& Compilation::getOrAddSideEffects(const Symbol& instanceBody) {
    auto& entry = instanceSideEffectMap[&instanceBody];
    if (!entry)
        entry = std::make_unique<InstanceSideEffects>();
    return *entry;
}